

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

void __thiscall QNetworkRequest::setOriginatingObject(QNetworkRequest *this,QObject *object)

{
  QObject *in_RSI;
  QObject *this_00;
  
  this_00 = in_RSI;
  QSharedDataPointer<QNetworkRequestPrivate>::operator->
            ((QSharedDataPointer<QNetworkRequestPrivate> *)in_RSI);
  QPointer<QObject>::operator=((QPointer<QObject> *)this_00,in_RSI);
  return;
}

Assistant:

void QNetworkRequest::setOriginatingObject(QObject *object)
{
    d->originatingObject = object;
}